

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int nni_file_type(char *name,int *ftype)

{
  int iVar1;
  int in_register_00000004;
  int iVar2;
  int local_14 [2];
  int t;
  
  local_14[0] = in_register_00000004;
  iVar1 = nni_plat_file_type(name,local_14);
  if (iVar1 == 0) {
    iVar2 = (local_14[0] != 1) + 1;
    if (local_14[0] == 0) {
      iVar2 = 0;
    }
    *ftype = iVar2;
  }
  return iVar1;
}

Assistant:

int
nni_file_type(const char *name, int *ftype)
{
	int rv;
	int t;

	if ((rv = nni_plat_file_type(name, &t)) != 0) {
		return (rv);
	}

	switch (t) {
	case NNI_PLAT_FILE_TYPE_FILE:
		*ftype = NNI_FILE_TYPE_FILE;
		break;
	case NNI_PLAT_FILE_TYPE_DIR:
		*ftype = NNI_FILE_TYPE_DIR;
		break;
	default:
		*ftype = NNI_FILE_TYPE_OTHER;
		break;
	}
	return (0);
}